

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O2

JoypadStateIter joypad_find_state(JoypadBuffer *buffer,Ticks ticks)

{
  size_t sVar1;
  JoypadState *pJVar2;
  JoypadChunk *chunk;
  JoypadChunk *pJVar3;
  JoypadChunk *pJVar4;
  JoypadState *end_;
  size_t sVar5;
  JoypadState *pJVar6;
  ulong uVar7;
  JoypadState *pJVar8;
  JoypadState *pJVar9;
  JoypadStateIter JVar10;
  
  pJVar4 = (buffer->sentinel).next;
  sVar5 = pJVar4->size;
  if (sVar5 != 0) {
    pJVar3 = (buffer->sentinel).prev;
    sVar1 = pJVar3->size;
    if (sVar1 != 0) {
      pJVar8 = pJVar4->data;
      if (pJVar8->ticks <= ticks && ticks != pJVar8->ticks) {
        pJVar9 = pJVar3->data;
        if (ticks < pJVar9[sVar1 - 1].ticks) {
          if (ticks - pJVar8->ticks < pJVar9[sVar1 - 1].ticks - ticks) {
            while (pJVar3 = pJVar4, pJVar8[sVar5 - 1].ticks <= ticks) {
              pJVar4 = pJVar3->next;
              sVar5 = pJVar4->size;
              pJVar8 = pJVar4->data;
            }
          }
          else {
            while (ticks < pJVar9->ticks) {
              pJVar3 = pJVar3->prev;
              pJVar9 = pJVar3->data;
            }
            sVar5 = pJVar3->size;
          }
          if (sVar5 == 0) {
LAB_00191ed6:
            __assert_fail("lower_bound != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c"
                          ,0x85,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
          }
          pJVar9 = pJVar3->data;
          pJVar6 = pJVar9 + sVar5;
          do {
            uVar7 = (long)pJVar6 - (long)pJVar9 >> 4;
            if ((long)uVar7 < 2) {
              pJVar8 = pJVar9;
              if (pJVar9 == (JoypadState *)0x0) goto LAB_00191ed6;
              break;
            }
            pJVar8 = (JoypadState *)(pJVar9->padding + (uVar7 & 0xfffffffffffffffe) * 8 + -9);
            pJVar2 = pJVar8;
            if (pJVar8->ticks <= ticks) {
              pJVar9 = pJVar8;
              pJVar2 = pJVar6;
            }
            pJVar6 = pJVar2;
          } while (pJVar8->ticks != ticks);
          pJVar4 = pJVar3;
          if (ticks < pJVar8->ticks) {
            __assert_fail("result.state->ticks <= ticks",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c"
                          ,0x88,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
          }
        }
        else {
          pJVar8 = pJVar9 + (sVar1 - 1);
          pJVar4 = pJVar3;
        }
      }
      JVar10.state = pJVar8;
      JVar10.chunk = pJVar4;
      return JVar10;
    }
  }
  __assert_fail("first_chunk->size != 0 && last_chunk->size != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",0x65
                ,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
}

Assistant:

JoypadStateIter joypad_find_state(JoypadBuffer* buffer, Ticks ticks) {
  /* TODO(binji): Use a skip list if this is too slow? */
  JoypadStateIter result;
  JoypadChunk* first_chunk = buffer->sentinel.next;
  JoypadChunk* last_chunk = buffer->sentinel.prev;
  assert(first_chunk->size != 0 && last_chunk->size != 0);
  Ticks first_ticks = first_chunk->data[0].ticks;
  Ticks last_ticks = last_chunk->data[last_chunk->size - 1].ticks;
  if (ticks <= first_ticks) {
    /* At or past the beginning. */
    result.chunk = first_chunk;
    result.state = &first_chunk->data[0];
    return result;
  } else if (ticks >= last_ticks) {
    /* At or past the end. */
    result.chunk = last_chunk;
    result.state = &last_chunk->data[last_chunk->size - 1];
    return result;
  } else if (ticks - first_ticks < last_ticks - ticks) {
    /* Closer to the beginning. */
    JoypadChunk* chunk = first_chunk;
    while (ticks >= chunk->data[chunk->size - 1].ticks) {
      chunk = chunk->next;
    }
    result.chunk = chunk;
  } else {
    /* Closer to the end. */
    JoypadChunk* chunk = last_chunk;
    while (ticks < chunk->data[0].ticks) {
      chunk = chunk->prev;
    }
    result.chunk = chunk;
  }

  JoypadState* begin = result.chunk->data;
  JoypadState* end = begin + result.chunk->size;
  LOWER_BOUND(JoypadState, lower_bound, begin, end, ticks, GET_TICKS, CMP_LT);
  assert(lower_bound != NULL); /* The chunk should not be empty. */

  result.state = lower_bound;
  assert(result.state->ticks <= ticks);
  return result;
}